

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalFileLog.cpp
# Opt level: O3

void ApprovalFileLog::initialize(void)

{
  string local_50;
  string local_30;
  
  if (initialize()::isInitialized == '\0') {
    initialize()::isInitialized = '\x01';
    getLogFilePath_abi_cxx11_();
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    ApprovalTests::FileUtils::writeToFile(&local_30,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void ApprovalFileLog::initialize()
{
    static bool isInitialized{false};
    if (isInitialized)
    {
        return;
    }
    isInitialized = true;
    ApprovalTests::FileUtils::writeToFile(getLogFilePath(), "");
}